

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O0

uint32_t fnode_service_recv_cmd(fnode_service_t *svc)

{
  char resp_freq_str [5];
  char keepalive_str [5];
  fcmd_conf *conf;
  uint32_t cmd;
  fnet_address_t addr;
  size_t read_len;
  char buf [65536];
  undefined4 in_stack_fffffffffffeff40;
  undefined2 in_stack_fffffffffffeff44;
  undefined2 in_stack_fffffffffffeff46;
  undefined2 in_stack_fffffffffffeff48;
  undefined1 in_stack_fffffffffffeff4a;
  undefined4 in_stack_fffffffffffeff4b;
  undefined1 in_stack_fffffffffffeff4f;
  size_t in_stack_fffffffffffeff50;
  undefined4 in_stack_fffffffffffeff58;
  undefined4 in_stack_fffffffffffeff5c;
  fnet_socket_t in_stack_fffffffffffeff60;
  
  fnet_socket_recvfrom
            (in_stack_fffffffffffeff60,
             (char *)CONCAT44(in_stack_fffffffffffeff5c,in_stack_fffffffffffeff58),
             in_stack_fffffffffffeff50,
             (size_t *)
             CONCAT17(in_stack_fffffffffffeff4f,
                      CONCAT43(in_stack_fffffffffffeff4b,
                               CONCAT12(in_stack_fffffffffffeff4a,in_stack_fffffffffffeff48))),
             (fnet_address_t *)
             CONCAT26(in_stack_fffffffffffeff46,
                      CONCAT24(in_stack_fffffffffffeff44,in_stack_fffffffffffeff40)));
  return 0;
}

Assistant:

uint32_t fnode_service_recv_cmd(fnode_service_t *svc)
{
    char buf[65536];
    size_t read_len = 0;
    fnet_address_t addr;

    if (fnet_socket_recvfrom(svc->socket, buf, sizeof buf, &read_len, &addr))
    {
        if (read_len < FCMD_ID_LENGTH)
            return false;

        uint32_t const cmd = *(uint32_t const*)buf;

        switch(cmd)
        {
            case FCMD_CONF:
            {
                if (read_len < sizeof(fcmd_conf))
                    return FCMD_NVLD;
                fcmd_conf const *conf = (fcmd_conf const *)buf;
                char keepalive_str[sizeof conf->keepalive + 1];
                char resp_freq_str[sizeof conf->resp_freq + 1];
                memcpy(keepalive_str, conf->keepalive, sizeof conf->keepalive);
                memcpy(resp_freq_str, conf->resp_freq, sizeof conf->resp_freq);
                keepalive_str[sizeof conf->keepalive] = 0;
                resp_freq_str[sizeof conf->resp_freq] = 0;
                svc->keepalive = atoi(keepalive_str);
                svc->resp_freq = atoi(resp_freq_str);
                svc->server = addr;
                return cmd;
            }

            case FCMD_PONG:
            {
                return read_len == sizeof(fcmd_pong) ? cmd : FCMD_NVLD;
            }

            case FCMD_DATA:
            {
                svc->data_handler(cmd, buf + FCMD_ID_LENGTH, read_len - FCMD_ID_LENGTH);
                return cmd;
            }
        }
    }
    return false;
}